

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dangical.cpp
# Opt level: O0

UBool calendar_dangi_cleanup(void)

{
  if (gDangiCalendarZoneAstroCalc != (TimeZone *)0x0) {
    if (gDangiCalendarZoneAstroCalc != (TimeZone *)0x0) {
      (*(gDangiCalendarZoneAstroCalc->super_UObject)._vptr_UObject[1])();
    }
    gDangiCalendarZoneAstroCalc = (TimeZone *)0x0;
  }
  icu_63::UInitOnce::reset(&gDangiCalendarInitOnce);
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool calendar_dangi_cleanup(void) {
    if (gDangiCalendarZoneAstroCalc) {
        delete gDangiCalendarZoneAstroCalc;
        gDangiCalendarZoneAstroCalc = NULL;
    }
    gDangiCalendarInitOnce.reset();
    return TRUE;
}